

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

int __thiscall r_memory_map::_get_posix_advice(r_memory_map *this,int advice)

{
  uint local_18;
  int posixAdvice;
  int advice_local;
  r_memory_map *this_local;
  
  local_18 = (uint)((advice & 1U) != 0);
  if ((advice & 2U) != 0) {
    local_18 = local_18 | 2;
  }
  if ((advice & 4U) != 0) {
    local_18 = 3;
  }
  if ((advice & 8U) != 0) {
    local_18 = local_18 | 4;
  }
  return local_18;
}

Assistant:

int r_memory_map::_get_posix_advice(int advice) const
{
    int posixAdvice = 0;

    if(advice & MM_ADVICE_RANDOM)
        posixAdvice |= MADV_RANDOM;
    if(advice & MM_ADVICE_SEQUENTIAL)
        posixAdvice |= MADV_SEQUENTIAL;
    if(advice & MM_ADVICE_WILLNEED)
        posixAdvice |= MADV_WILLNEED;
    if(advice & MM_ADVICE_DONTNEED)
        posixAdvice |= MADV_DONTNEED;

    return posixAdvice;
}